

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O1

QModelIndex * __thiscall
QTransposeProxyModelPrivate::uncheckedMapFromSource
          (QModelIndex *__return_storage_ptr__,QTransposeProxyModelPrivate *this,
          QModelIndex *sourceIndex)

{
  int iVar1;
  QObject *pQVar2;
  quintptr qVar3;
  parameter_type pQVar4;
  
  pQVar4 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           ::value(&(this->super_QAbstractProxyModelPrivate).model);
  if ((((pQVar4 == (parameter_type)0x0) || (iVar1 = sourceIndex->r, iVar1 < 0)) ||
      (sourceIndex->c < 0)) || ((sourceIndex->m).ptr == (QAbstractItemModel *)0x0)) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  }
  else {
    pQVar2 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
             super_QObjectPrivate.super_QObjectData.q_ptr;
    qVar3 = sourceIndex->i;
    __return_storage_ptr__->r = sourceIndex->c;
    __return_storage_ptr__->c = iVar1;
    __return_storage_ptr__->i = qVar3;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)pQVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QTransposeProxyModelPrivate::uncheckedMapFromSource(const QModelIndex &sourceIndex) const
{
    if (!model || !sourceIndex.isValid())
        return QModelIndex();
    Q_Q(const QTransposeProxyModel);
    return q->createIndex(sourceIndex.column(), sourceIndex.row(), sourceIndex.internalPointer());
}